

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_StatusCode
UA_SecureChannel_processSequenceNumber(UA_SecureChannel *channel,UA_UInt32 SequenceNumber)

{
  UA_UInt32 SequenceNumber_local;
  UA_SecureChannel *channel_local;
  
  if (SequenceNumber != channel->receiveSequenceNumber + 1) {
    if ((channel->receiveSequenceNumber + 1 < 0xfffffc00) || (0x3ff < SequenceNumber)) {
      return 0x80130000;
    }
    channel->receiveSequenceNumber = SequenceNumber - 1;
  }
  channel->receiveSequenceNumber = channel->receiveSequenceNumber + 1;
  return 0;
}

Assistant:

static UA_StatusCode
UA_SecureChannel_processSequenceNumber(UA_SecureChannel *channel, UA_UInt32 SequenceNumber) {
    /* Does the sequence number match? */
    if(SequenceNumber != channel->receiveSequenceNumber + 1) {
        if(channel->receiveSequenceNumber + 1 > 4294966271 && SequenceNumber < 1024)
            channel->receiveSequenceNumber = SequenceNumber - 1; /* Roll over */
        else
            return UA_STATUSCODE_BADSECURITYCHECKSFAILED;
    }
    ++channel->receiveSequenceNumber;
    return UA_STATUSCODE_GOOD;
}